

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4s.c
# Opt level: O0

int roslz4_decompress(roslz4_stream *str)

{
  int iVar1;
  long in_RDI;
  int ret;
  stream_state *state;
  roslz4_stream *in_stack_00000028;
  roslz4_stream *in_stack_ffffffffffffffd8;
  roslz4_stream *str_00;
  int local_4;
  
  str_00 = *(roslz4_stream **)(in_RDI + 0x28);
  if (str_00->total_out == 0) {
    local_4 = processHeader(in_stack_00000028);
    if (0 < local_4) {
      while( true ) {
        if (*(int *)(in_RDI + 8) < 1) {
          return 0;
        }
        iVar1 = readBlockSize(in_stack_ffffffffffffffd8);
        if (iVar1 == 0) break;
        if (*(int *)&str_00[1].output_next == 0) {
          iVar1 = readChecksum(str_00);
          return iVar1;
        }
        iVar1 = readBlock(str_00);
        if (iVar1 == 0) {
          return 0;
        }
        if (iVar1 < 0) {
          return iVar1;
        }
        iVar1 = decompressBlock(str_00);
        if (iVar1 < 0) {
          return iVar1;
        }
      }
      local_4 = 0;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int roslz4_decompress(roslz4_stream *str) {
  stream_state *state = str->state;
  if (state->finished) {
    return ROSLZ4_ERROR; // Already reached end of stream
  }

  // Return if header isn't present or error was encountered
  int ret = processHeader(str);
  if (ret <= 0) {
    return ret;
  }

  // Read in blocks and decompress them as long as there's data to be processed
  while (str->input_left > 0) {
    ret = readBlockSize(str);
    if (ret == 0) { return ROSLZ4_OK; }

    if (state->block_size == kEndOfStream) {
      return readChecksum(str);
    }

    ret = readBlock(str);
    if (ret == 0) { return ROSLZ4_OK; }
    else if (ret < 0) { return ret; }

    ret = decompressBlock(str);
    if (ret < 0) { return ret; }
  }
  return ROSLZ4_OK;
}